

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeFont(ImFont *font)

{
  ImVec2 IVar1;
  ushort uVar2;
  ImFontConfig *pIVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *this;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  ImU32 col;
  ImFontGlyph *pIVar8;
  ImU32 col_00;
  int iVar9;
  ImFont *pos;
  char *pcVar10;
  ImWchar c;
  uint n;
  int iVar11;
  long lVar12;
  uint n_1;
  uint uVar13;
  int config_i;
  ulong uVar14;
  uint base;
  uint c_begin;
  void *ptr_id;
  float fVar15;
  float fVar16;
  ImVec2 cell_p1;
  ImVec2 cell_p2;
  char c_str [5];
  float local_48;
  
  pcVar10 = "";
  if (font->ConfigData != (ImFontConfig *)0x0) {
    pcVar10 = font->ConfigData->Name;
  }
  bVar6 = TreeNode(font,"Font: \"%s\"\n%.2f px, %d glyphs, %d file(s)",
                   SUB84((double)font->FontSize,0),pcVar10,(ulong)(uint)(font->Glyphs).Size,
                   (ulong)(uint)(int)font->ConfigDataCount);
  SameLine(0.0,-1.0);
  bVar7 = SmallButton("Set as default");
  if (bVar7) {
    (GImGui->IO).FontDefault = font;
  }
  if (bVar6) {
    PushFont((ImFont *)0x169b47);
    Text("The quick brown fox jumps over the lazy dog");
    PopFont();
    pIVar5 = GImGui;
    fVar15 = GImGui->FontSize;
    (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
    (pIVar5->NextItemData).Width = fVar15 * 8.0;
    DragFloat("Font scale",&font->Scale,0.005,0.3,2.0,"%.1f",0);
    SameLine(0.0,-1.0);
    MetricsHelpMarker(
                     "Note that the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system will be rewritten in the future to make scaling more flexible.)"
                     );
    Text("Ascent: %f, Descent: %f, Height: %f",SUB84((double)font->Ascent,0),(double)font->Descent,
         (double)(font->Ascent - font->Descent));
    uVar2 = font->FallbackChar;
    ImTextCharToUtf8(c_str,(uint)uVar2);
    Text("Fallback character: \'%s\' (U+%04X)",c_str,(ulong)(uint)uVar2);
    uVar2 = font->EllipsisChar;
    ImTextCharToUtf8(c_str,(uint)uVar2);
    Text("Ellipsis character: \'%s\' (U+%04X)",c_str,(ulong)(uint)uVar2);
    fVar15 = (float)font->MetricsTotalSurface;
    if (fVar15 < 0.0) {
      fVar15 = sqrtf(fVar15);
    }
    else {
      fVar15 = SQRT(fVar15);
    }
    Text("Texture Area: about %d px ~%dx%d px",(ulong)(uint)font->MetricsTotalSurface,
         (ulong)(uint)(int)fVar15);
    lVar12 = 0x5a;
    for (uVar14 = 0; (long)uVar14 < (long)font->ConfigDataCount; uVar14 = uVar14 + 1) {
      pIVar3 = font->ConfigData;
      if (pIVar3 != (ImFontConfig *)0x0) {
        BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d, Offset: (%.1f,%.1f)",
                   SUB84((double)*(float *)((long)pIVar3 + lVar12 + -0x2e),0),
                   (double)*(float *)((long)pIVar3 + lVar12 + -0x2a),uVar14 & 0xffffffff,
                   pIVar3->Name + lVar12 + -0x5a,(ulong)*(uint *)((long)pIVar3 + lVar12 + -0x42),
                   (ulong)*(uint *)((long)pIVar3 + lVar12 + -0x3e),
                   (ulong)*(byte *)((long)pIVar3 + lVar12 + -0x3a));
      }
      lVar12 = lVar12 + 0x90;
    }
    bVar6 = TreeNode("Glyphs","Glyphs (%d)",(ulong)(uint)(font->Glyphs).Size);
    if (bVar6) {
      pIVar4 = GImGui->CurrentWindow;
      pIVar4->WriteAccessed = true;
      this = pIVar4->DrawList;
      col = GetColorU32(0,1.0);
      fVar15 = font->FontSize;
      fVar16 = (GImGui->Style).ItemSpacing.y + fVar15;
      ptr_id = (void *)0x0;
      while (c_begin = (uint)ptr_id, c_begin < 0x10000) {
        if (((ulong)ptr_id & 0xfff) == 0) {
          bVar6 = ImFont::IsGlyphRangeUnused(font,c_begin,c_begin | 0xfff);
          if (!bVar6) goto LAB_00169d90;
          c_begin = c_begin | 0xf00;
        }
        else {
LAB_00169d90:
          uVar14 = 0;
          iVar11 = 0;
          while( true ) {
            iVar9 = (int)uVar14;
            if (iVar11 == 0x100) break;
            pIVar8 = ImFont::FindGlyphNoFallback(font,(short)ptr_id + (short)iVar11);
            uVar14 = (ulong)((iVar9 + 1) - (uint)(pIVar8 == (ImFontGlyph *)0x0));
            iVar11 = iVar11 + 1;
          }
          if (iVar9 != 0) {
            pcVar10 = "glyphs";
            if (iVar9 == 1) {
              pcVar10 = "glyph";
            }
            bVar6 = TreeNode(ptr_id,"U+%04X..U+%04X (%d %s)",ptr_id,(ulong)(c_begin + 0xff),uVar14,
                             pcVar10);
            if (bVar6) {
              IVar1 = (GImGui->CurrentWindow->DC).CursorPos;
              uVar14 = 0;
              while (uVar13 = (uint)uVar14, uVar13 != 0x100) {
                local_48 = IVar1.x;
                cell_p1.x = (float)(uVar13 & 0xf) * fVar16 + local_48;
                cell_p1.y = (float)(int)(uVar14 >> 4) * fVar16 + IVar1.y;
                cell_p2.x = cell_p1.x + fVar15;
                cell_p2.y = cell_p1.y + fVar15;
                c = (short)ptr_id + (short)uVar14;
                pIVar8 = ImFont::FindGlyphNoFallback(font,c);
                col_00 = 0x64ffffff;
                if (pIVar8 == (ImFontGlyph *)0x0) {
                  col_00 = 0x32ffffff;
                }
                ImDrawList::AddRect(this,&cell_p1,&cell_p2,col_00,0.0,0,1.0);
                if (pIVar8 != (ImFontGlyph *)0x0) {
                  pos = (ImFont *)&cell_p1;
                  ImFont::RenderChar(font,this,fVar15,(ImVec2 *)pos,col,c);
                  bVar6 = IsMouseHoveringRect((ImVec2 *)pos,&cell_p2,true);
                  if (bVar6) {
                    BeginTooltip();
                    DebugNodeFontGlyph(pos,pIVar8);
                    End();
                  }
                }
                uVar14 = (ulong)(uVar13 + 1);
              }
              cell_p1.x = fVar16 * 16.0;
              cell_p1.y = fVar16 * 16.0;
              Dummy(&cell_p1);
              TreePop();
            }
          }
        }
        ptr_id = (void *)(ulong)(c_begin + 0x100);
      }
      TreePop();
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeFont(ImFont* font)
{
    bool opened = TreeNode(font, "Font: \"%s\"\n%.2f px, %d glyphs, %d file(s)",
        font->ConfigData ? font->ConfigData[0].Name : "", font->FontSize, font->Glyphs.Size, font->ConfigDataCount);
    SameLine();
    if (SmallButton("Set as default"))
        GetIO().FontDefault = font;
    if (!opened)
        return;

    // Display preview text
    PushFont(font);
    Text("The quick brown fox jumps over the lazy dog");
    PopFont();

    // Display details
    SetNextItemWidth(GetFontSize() * 8);
    DragFloat("Font scale", &font->Scale, 0.005f, 0.3f, 2.0f, "%.1f");
    SameLine(); MetricsHelpMarker(
        "Note that the default embedded font is NOT meant to be scaled.\n\n"
        "Font are currently rendered into bitmaps at a given size at the time of building the atlas. "
        "You may oversample them to get some flexibility with scaling. "
        "You can also render at multiple sizes and select which one to use at runtime.\n\n"
        "(Glimmer of hope: the atlas system will be rewritten in the future to make scaling more flexible.)");
    Text("Ascent: %f, Descent: %f, Height: %f", font->Ascent, font->Descent, font->Ascent - font->Descent);
    char c_str[5];
    Text("Fallback character: '%s' (U+%04X)", ImTextCharToUtf8(c_str, font->FallbackChar), font->FallbackChar);
    Text("Ellipsis character: '%s' (U+%04X)", ImTextCharToUtf8(c_str, font->EllipsisChar), font->EllipsisChar);
    const int surface_sqrt = (int)ImSqrt((float)font->MetricsTotalSurface);
    Text("Texture Area: about %d px ~%dx%d px", font->MetricsTotalSurface, surface_sqrt, surface_sqrt);
    for (int config_i = 0; config_i < font->ConfigDataCount; config_i++)
        if (font->ConfigData)
            if (const ImFontConfig* cfg = &font->ConfigData[config_i])
                BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d, Offset: (%.1f,%.1f)",
                    config_i, cfg->Name, cfg->OversampleH, cfg->OversampleV, cfg->PixelSnapH, cfg->GlyphOffset.x, cfg->GlyphOffset.y);

    // Display all glyphs of the fonts in separate pages of 256 characters
    if (TreeNode("Glyphs", "Glyphs (%d)", font->Glyphs.Size))
    {
        ImDrawList* draw_list = GetWindowDrawList();
        const ImU32 glyph_col = GetColorU32(ImGuiCol_Text);
        const float cell_size = font->FontSize * 1;
        const float cell_spacing = GetStyle().ItemSpacing.y;
        for (unsigned int base = 0; base <= IM_UNICODE_CODEPOINT_MAX; base += 256)
        {
            // Skip ahead if a large bunch of glyphs are not present in the font (test in chunks of 4k)
            // This is only a small optimization to reduce the number of iterations when IM_UNICODE_MAX_CODEPOINT
            // is large // (if ImWchar==ImWchar32 we will do at least about 272 queries here)
            if (!(base & 4095) && font->IsGlyphRangeUnused(base, base + 4095))
            {
                base += 4096 - 256;
                continue;
            }

            int count = 0;
            for (unsigned int n = 0; n < 256; n++)
                if (font->FindGlyphNoFallback((ImWchar)(base + n)))
                    count++;
            if (count <= 0)
                continue;
            if (!TreeNode((void*)(intptr_t)base, "U+%04X..U+%04X (%d %s)", base, base + 255, count, count > 1 ? "glyphs" : "glyph"))
                continue;

            // Draw a 16x16 grid of glyphs
            ImVec2 base_pos = GetCursorScreenPos();
            for (unsigned int n = 0; n < 256; n++)
            {
                // We use ImFont::RenderChar as a shortcut because we don't have UTF-8 conversion functions
                // available here and thus cannot easily generate a zero-terminated UTF-8 encoded string.
                ImVec2 cell_p1(base_pos.x + (n % 16) * (cell_size + cell_spacing), base_pos.y + (n / 16) * (cell_size + cell_spacing));
                ImVec2 cell_p2(cell_p1.x + cell_size, cell_p1.y + cell_size);
                const ImFontGlyph* glyph = font->FindGlyphNoFallback((ImWchar)(base + n));
                draw_list->AddRect(cell_p1, cell_p2, glyph ? IM_COL32(255, 255, 255, 100) : IM_COL32(255, 255, 255, 50));
                if (!glyph)
                    continue;
                font->RenderChar(draw_list, cell_size, cell_p1, glyph_col, (ImWchar)(base + n));
                if (IsMouseHoveringRect(cell_p1, cell_p2) && BeginTooltip())
                {
                    DebugNodeFontGlyph(font, glyph);
                    EndTooltip();
                }
            }
            Dummy(ImVec2((cell_size + cell_spacing) * 16, (cell_size + cell_spacing) * 16));
            TreePop();
        }
        TreePop();
    }
    TreePop();
}